

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O0

TableauPileMouseLeftButtonDownEventData * __thiscall
solitaire::events::EventsProcessor::getTableauPileMouseLeftButtonDownEventData
          (TableauPileMouseLeftButtonDownEventData *__return_storage_ptr__,EventsProcessor *this,
          PileId *id,uint cardIndex)

{
  Context *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_type sVar4;
  PileId local_38;
  PileId local_34;
  TableauPile *local_30;
  TableauPile *tableauPile;
  Solitaire *solitaire;
  PileId *pPStack_18;
  uint cardIndex_local;
  PileId *id_local;
  EventsProcessor *this_local;
  TableauPile *pTVar3;
  
  solitaire._4_4_ = cardIndex;
  pPStack_18 = id;
  id_local = (PileId *)this;
  iVar2 = (*this->context->_vptr_Context[4])();
  pTVar3 = (TableauPile *)CONCAT44(extraout_var,iVar2);
  tableauPile = pTVar3;
  piles::PileId::PileId(&local_34,id);
  iVar2 = (*(pTVar3->super_Archiver)._vptr_Archiver[0xe])(pTVar3,&local_34);
  local_30 = (TableauPile *)CONCAT44(extraout_var_00,iVar2);
  __return_storage_ptr__->solitaire = (Solitaire *)tableauPile;
  __return_storage_ptr__->pile = local_30;
  pCVar1 = this->context;
  piles::PileId::PileId(&local_38,id);
  iVar2 = (*pCVar1->_vptr_Context[8])(pCVar1,&local_38);
  __return_storage_ptr__->collider = (TableauPileCollider *)CONCAT44(extraout_var_01,iVar2);
  iVar2 = (*(local_30->super_Archiver)._vptr_Archiver[7])();
  sVar4 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::size
                    ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                     CONCAT44(extraout_var_02,iVar2));
  __return_storage_ptr__->cardsQuantity = (uint)sVar4;
  __return_storage_ptr__->cardIndex = solitaire._4_4_;
  return __return_storage_ptr__;
}

Assistant:

EventsProcessor::TableauPileMouseLeftButtonDownEventData
EventsProcessor::getTableauPileMouseLeftButtonDownEventData(
    const PileId id, const unsigned cardIndex) const
{
    auto& solitaire = context.getSolitaire();
    auto& tableauPile = solitaire.getTableauPile(id);

    return TableauPileMouseLeftButtonDownEventData {
        solitaire,
        tableauPile,
        context.getTableauPileCollider(id),
        static_cast<unsigned>(tableauPile.getCards().size()),
        cardIndex
    };
}